

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::convert_grids_to_quads(Ref<embree::SceneGraph::Node> *node)

{
  long *plVar1;
  Node *pNVar2;
  bool bVar3;
  Ref<embree::SceneGraph::Node> *pRVar4;
  long *plVar5;
  size_type sVar6;
  reference pvVar7;
  long *in_RSI;
  Node *in_RDI;
  Ref<embree::SceneGraph::GridMeshNode> gmesh;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::MultiTransformNode> xfmNode_1;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  long *local_3e8;
  long *local_378;
  long *local_318;
  Ref<embree::SceneGraph::GridMeshNode> *gmesh_00;
  Ref<embree::SceneGraph::Node> *local_2b8;
  Node *local_270;
  ulong local_268;
  long local_250;
  Node *local_238;
  
  if (*in_RSI == 0) {
    local_2b8 = (Ref<embree::SceneGraph::Node> *)0x0;
  }
  else {
    local_2b8 = (Ref<embree::SceneGraph::Node> *)
                __dynamic_cast(*in_RSI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (local_2b8 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (**(code **)&local_2b8->ptr->fileName)();
  }
  if (local_2b8 == (Ref<embree::SceneGraph::Node> *)0x0) {
    gmesh_00 = (Ref<embree::SceneGraph::GridMeshNode> *)*in_RSI;
    if (gmesh_00 == (Ref<embree::SceneGraph::GridMeshNode> *)0x0) {
      local_318 = (long *)0x0;
    }
    else {
      local_318 = (long *)__dynamic_cast(gmesh_00,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    if (local_318 == (long *)0x0) {
      if (*in_RSI == 0) {
        local_378 = (long *)0x0;
      }
      else {
        local_378 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      if (local_378 == (long *)0x0) {
        if (*in_RSI == 0) {
          local_3e8 = (long *)0x0;
        }
        else {
          local_3e8 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&GridMeshNode::typeinfo,0);
        }
        if (local_3e8 == (long *)0x0) {
          bVar3 = false;
        }
        else {
          (**(code **)(*local_3e8 + 0x10))();
          if (local_3e8 != (long *)0x0) {
            (**(code **)(*local_3e8 + 0x10))();
          }
          convert_grids_to_quads(gmesh_00);
          if (local_3e8 != (long *)0x0) {
            (**(code **)(*local_3e8 + 0x18))();
          }
          bVar3 = true;
        }
        if (local_3e8 != (long *)0x0) {
          (**(code **)(*local_3e8 + 0x18))();
        }
        if (!bVar3) goto LAB_001dabd7;
      }
      else {
        (**(code **)(*local_378 + 0x10))();
        for (local_268 = 0;
            sVar6 = std::
                    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                            *)(local_378 + 0xd)), local_268 < sVar6; local_268 = local_268 + 1) {
          pvVar7 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_378 + 0xd),local_268);
          pNVar2 = pvVar7->ptr;
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
          }
          convert_grids_to_quads(local_2b8);
          pvVar7 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_378 + 0xd),local_268);
          if (pvVar7->ptr != (Node *)0x0) {
            (*(pvVar7->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          pvVar7->ptr = local_270;
          local_270 = (Node *)0x0;
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
          }
        }
LAB_001dabd7:
        bVar3 = false;
      }
      if (local_378 != (long *)0x0) {
        (**(code **)(*local_378 + 0x18))();
      }
      if (!bVar3) goto LAB_001dac73;
    }
    else {
      (**(code **)(*local_318 + 0x10))();
      plVar1 = (long *)local_318[0x10];
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x10))();
      }
      convert_grids_to_quads(local_2b8);
      plVar5 = local_318 + 0x10;
      if (*plVar5 != 0) {
        (**(code **)(*(long *)*plVar5 + 0x18))();
      }
      *plVar5 = local_250;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x18))();
      }
LAB_001dac73:
      bVar3 = false;
    }
    if (local_318 != (long *)0x0) {
      (**(code **)(*local_318 + 0x18))();
    }
    if (bVar3) goto LAB_001dad1d;
  }
  else {
    pNVar2 = local_2b8[0x13].ptr;
    if (pNVar2 != (Node *)0x0) {
      (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
    }
    convert_grids_to_quads(local_2b8);
    pRVar4 = local_2b8 + 0x13;
    if (pRVar4->ptr != (Node *)0x0) {
      (*(pRVar4->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pRVar4->ptr = local_238;
    if (pNVar2 != (Node *)0x0) {
      (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
    }
  }
  bVar3 = false;
LAB_001dad1d:
  if (local_2b8 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (*(code *)(local_2b8->ptr->fileName)._M_string_length)();
  }
  if (!bVar3) {
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)*in_RSI;
    *in_RSI = 0;
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_grids_to_quads(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_grids_to_quads(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_grids_to_quads(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_grids_to_quads(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::GridMeshNode> gmesh = node.dynamicCast<SceneGraph::GridMeshNode>()) {
      return convert_grids_to_quads(gmesh);
    }
    return node;
  }